

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O0

void __thiscall
test::prod_test::iu_PeepClassTest_x_iutest_x_StaticFunction_Test::Body
          (iu_PeepClassTest_x_iutest_x_StaticFunction_Test *this)

{
  bool bVar1;
  _func_void_int *p_Var2;
  char *message;
  AssertionHelper local_210;
  Fixed local_1e0;
  int local_48 [2];
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  type peep;
  iu_PeepClassTest_x_iutest_x_StaticFunction_Test *this_local;
  
  p_Var2 = iutest::detail::peep::Peep::peep_static_impl::operator_cast_to_function_pointer
                     ((peep_static_impl *)&iutest_ar.field_0x27);
  (*p_Var2)(0x65);
  iutest::detail::AlwaysZero();
  local_48[1] = 0x65;
  local_48[0] = ProdClass::GetY();
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_40,"101","ProdClass::GetY()",local_48 + 1,local_48);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
    message = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x130,message,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_210,&local_1e0);
    iutest::AssertionHelper::~AssertionHelper(&local_210);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  return;
}

Assistant:

IUTEST(PeepClassTest, StaticFunction)
{
    IUTEST_PEEP(ProdClass, SetY) peep;
    peep(101);
    IUTEST_EXPECT_EQ(101, ProdClass::GetY());
}